

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.h
# Opt level: O1

void __thiscall
mnf::CartesianProduct::CartesianProduct(CartesianProduct *this,CartesianProduct *param_1)

{
  pointer pcVar1;
  Index IVar2;
  Index IVar3;
  undefined8 uVar4;
  
  (this->super_Manifold).super_RefCounter = 0;
  (this->super_Manifold).super_ValidManifold = 0x677d7257;
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__Manifold_001417c0;
  (this->super_Manifold).instanceId_ = (param_1->super_Manifold).instanceId_;
  (this->super_Manifold).name_._M_dataplus._M_p = (pointer)&(this->super_Manifold).name_.field_2;
  pcVar1 = (param_1->super_Manifold).name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Manifold).name_,pcVar1,
             pcVar1 + (param_1->super_Manifold).name_._M_string_length);
  IVar2 = (param_1->super_Manifold).dimension_;
  IVar3 = (param_1->super_Manifold).tangentDim_;
  uVar4 = *(undefined8 *)((long)&(param_1->super_Manifold).representationDim_ + 1);
  *(undefined8 *)((long)&(this->super_Manifold).tangentDim_ + 1) =
       *(undefined8 *)((long)&(param_1->super_Manifold).tangentDim_ + 1);
  *(undefined8 *)((long)&(this->super_Manifold).representationDim_ + 1) = uVar4;
  (this->super_Manifold).dimension_ = IVar2;
  (this->super_Manifold).tangentDim_ = IVar3;
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__CartesianProduct_00141470;
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::vector(&this->subManifolds_,&param_1->subManifolds_);
  std::vector<long,_std::allocator<long>_>::vector(&this->startIndexT_,&param_1->startIndexT_);
  std::vector<long,_std::allocator<long>_>::vector(&this->startIndexR_,&param_1->startIndexR_);
  return;
}

Assistant:

class MANIFOLDS_API CartesianProduct : public Manifold
{
 public:
  /// \brief Default constructor
  CartesianProduct();

  /// \brief Constructor of the manifold from a list of manifolds
  CartesianProduct(const std::initializer_list<Manifold*> m);

  /// \brief Constructor of the manifold composed of \f$ m1\times m2\f$
  CartesianProduct(const Manifold& m1, const Manifold& m2);

  /// \brief Adds manifold m to the current composed manifold\n
  /// This method cannot be executed if the manifold is locked
  CartesianProduct& multiply(const Manifold& m);

  virtual size_t numberOfSubManifolds() const;
  virtual const Manifold& operator()(const size_t i) const;

  virtual std::string description(const std::string& prefix = "",
                                  bool firstCall = true) const;
  virtual std::string toString(
      const ConstRefVec& val, const std::string& prefix = "",
      const Eigen::IOFormat& fmt = mnf::defaultFormat) const;

  virtual bool isElementary() const;
  virtual bool isSameTopology(const Manifold& other) const;

 protected:
  virtual bool isInM_(const Eigen::VectorXd& val, double prec) const;
  virtual void forceOnM_(RefVec out, const ConstRefVec& in) const;
  virtual void getIdentityOnTxM_(RefMat out, const ConstRefVec& x) const;

  virtual Index startR(const size_t i) const;
  virtual Index startT(const size_t i) const;

  virtual void createRandomPoint_(RefVec out, const double coeff) const;
  virtual void retractation_(RefVec out, const ConstRefVec& x,
                             const ConstRefVec& v) const;
  virtual void pseudoLog_(RefVec out, const ConstRefVec& x,
                          const ConstRefVec& y) const;
  virtual void pseudoLog0_(RefVec out, const ConstRefVec& x) const;
  virtual void setZero_(RefVec out) const;
  virtual Eigen::MatrixXd diffRetractation_(const ConstRefVec& x) const;
  virtual void applyDiffRetractation_(RefMat out, const ConstRefMat& in,
                                      const ConstRefVec& x) const;
  virtual Eigen::MatrixXd diffPseudoLog0_(const ConstRefVec& x) const;
  virtual void applyDiffPseudoLog0_(RefMat out, const ConstRefMat& in,
                                    const ConstRefVec& x) const;
  virtual void applyTransport_(RefMat out, const ConstRefMat& in,
                               const ConstRefVec& x,
                               const ConstRefVec& v) const;
  virtual void applyInvTransport_(RefMat out, const ConstRefMat& in,
                                  const ConstRefVec& x,
                                  const ConstRefVec& v) const;
  virtual void applyInvTransportOnTheRight_(RefMat out, const ConstRefMat& in,
                                            const ConstRefVec& x,
                                            const ConstRefVec& v) const;

  virtual void tangentConstraint_(RefMat out, const ConstRefVec& x) const;
  virtual bool isInTxM_(const ConstRefVec& x, const ConstRefVec& v,
                        const double& prec) const;
  virtual void forceOnTxM_(RefVec out, const ConstRefVec& in,
                           const ConstRefVec& x) const;
  virtual void limitMap_(RefVec out) const;
  virtual void getTypicalMagnitude_(RefVec out) const;
  virtual void getTrustMagnitude_(RefVec out) const;
  virtual long getTypeId() const;

  virtual std::shared_ptr<Manifold> getNewCopy_() const;

 protected:
  /// \brief List of pointers on all the manifolds in the cartesian product
  std::vector<std::shared_ptr<const Manifold>> subManifolds_;

 private:
  /// \brief List of start index of submanifolds in a vector of the
  /// tangent space
  std::vector<Index> startIndexT_;

  /// \brief List of start index of submanifolds in a vector of the
  /// representation space
  std::vector<Index> startIndexR_;
}